

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

auto_ptr<avro::InputStream> __thiscall
avro::fileInputStream(avro *this,char *filename,size_t bufferSize)

{
  int iVar1;
  BufferCopyIn *pBVar2;
  BufferCopyInInputStream *this_00;
  Exception *this_01;
  int *piVar3;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> in;
  char *local_118;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  
  pBVar2 = (BufferCopyIn *)operator_new(0x10);
  pBVar2->_vptr_BufferCopyIn = (_func_int **)&PTR__FileBufferCopyIn_001ec018;
  iVar1 = open(filename,0);
  *(int *)&pBVar2[1]._vptr_BufferCopyIn = iVar1;
  if (-1 < iVar1) {
    in._M_ptr = pBVar2;
    this_00 = (BufferCopyInInputStream *)operator_new(0x38);
    BufferCopyInInputStream::BufferCopyInInputStream(this_00,&in,bufferSize);
    *(BufferCopyInInputStream **)this = this_00;
    if (in._M_ptr != (BufferCopyIn *)0x0) {
      (*(in._M_ptr)->_vptr_BufferCopyIn[1])();
    }
    return (auto_ptr<avro::InputStream>)(InputStream *)this;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_110,"Cannot open file: %1%");
  piVar3 = __errno_location();
  local_118 = strerror(*piVar3);
  msg = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,char*const&>
                  (&local_110,&local_118);
  Exception::Exception(this_01,msg);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

auto_ptr<InputStream> fileInputStream(const char* filename,
    size_t bufferSize)
{
    auto_ptr<BufferCopyIn> in(new FileBufferCopyIn(filename));
    return auto_ptr<InputStream>( new BufferCopyInInputStream(in, bufferSize));
}